

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asctime.c
# Opt level: O3

char * asctime(tm *__tp)

{
  sprintf(asctime::rc,"%s %s%3d %.2d:%.2d:%.2d %d\n",_PDCLIB_lc_time_C.day_name_abbr[__tp->tm_wday],
          _PDCLIB_lc_time_C.month_name_abbr[__tp->tm_mon],(ulong)(uint)__tp->tm_mday,
          (ulong)(uint)__tp->tm_hour,(ulong)(uint)__tp->tm_min,(ulong)(uint)__tp->tm_sec,
          (ulong)(__tp->tm_year + 0x76c));
  return asctime::rc;
}

Assistant:

char * asctime( const struct tm * timeptr )
{
    static char rc[26];
    sprintf( rc, "%s %s%3d %.2d:%.2d:%.2d %d\n",
             _PDCLIB_lc_time_C.day_name_abbr[ timeptr->tm_wday ],
             _PDCLIB_lc_time_C.month_name_abbr[ timeptr->tm_mon ],
             timeptr->tm_mday,
             timeptr->tm_hour,
             timeptr->tm_min,
             timeptr->tm_sec,
             timeptr->tm_year + 1900 );
    return rc;
}